

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_proto3_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto3_unittest::TestProto3BytesMap::_InternalSerialize
          (TestProto3BytesMap *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_3
  *paVar1;
  MapField<proto3_unittest::TestProto3BytesMap_MapStringEntry_DoNotUse,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *this_00;
  int *piVar2;
  unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
  uVar3;
  long lVar4;
  long *plVar5;
  MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  char *in_R9;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  string_view field_name;
  string_view field_name_00;
  MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  TestProto3BytesMap *local_38;
  
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  if (*(int *)((long)&this->field_0 + 0x10) != 0) {
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
              ((MapFieldBase *)&(this->field_0)._impl_);
    if ((stream->is_serialization_deterministic_ == true) &&
       (paVar1 = &(this->field_0)._impl_.map_bytes_.
                  super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0,
       1 < (paVar1->map_).super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_elements_)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat(&local_48,&paVar1->map_);
      uVar3._M_t.
      super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
      .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl =
           (__uniq_ptr_data<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>,_true,_true>
            )(__uniq_ptr_data<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>,_true,_true>
              )local_48.items_;
      if (local_48.size_ != 0) {
        lVar4 = local_48.size_ << 4;
        lVar8 = 0;
        do {
          piVar2 = *(int **)((long)((long)uVar3._M_t.
                                          super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                          .
                                          super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>
                                          ._M_head_impl + 8) + lVar8);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                   ::InternalSerialize(1,piVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(piVar2 + 2),target,stream);
          lVar8 = lVar8 + 0x10;
        } while (lVar4 != lVar8);
      }
      if (local_48.items_._M_t.
          super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
          .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
           )0x0) {
        operator_delete__((void *)local_48.items_._M_t.
                                  super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                  .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>.
                                  _M_head_impl);
      }
    }
    else {
      uVar7 = *(uint *)((long)&this->field_0 + 0x18);
      uVar6 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x14)) {
        plVar5 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_bytes_.
                                             super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             .field_0 + 0x10) + uVar6 * 8);
        if (plVar5 != (long *)0x0) {
          do {
            do {
              target = google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                       ::InternalSerialize(1,(int *)(plVar5 + 1),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(plVar5 + 2),target,stream);
              plVar5 = (long *)*plVar5;
            } while (plVar5 != (long *)0x0);
            do {
              uVar7 = (int)uVar6 + 1;
              uVar6 = (ulong)uVar7;
              if (*(uint *)((long)&this->field_0 + 0x14) <= uVar7) goto LAB_00c73eb4;
              plVar5 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_bytes_.
                                                                                                      
                                                  super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0 + 0x10) + (ulong)uVar7 * 8);
            } while (plVar5 == (long *)0x0);
          } while( true );
        }
        goto LAB_00c74085;
      }
    }
  }
LAB_00c73eb4:
  this_00 = &(this->field_0)._impl_.map_string_;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
  if (*(int *)((long)&this->field_0 + 0x40) != 0) {
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
    if ((stream->is_serialization_deterministic_ == true) &&
       (paVar1 = &(this->field_0)._impl_.map_string_.
                  super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0,
       1 < (paVar1->map_).super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_elements_)) {
      local_38 = this;
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat(&local_48,&paVar1->map_);
      uVar3._M_t.
      super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
      .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl =
           (__uniq_ptr_data<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>,_true,_true>
            )(__uniq_ptr_data<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>,_true,_true>
              )local_48.items_;
      if (local_48.size_ != 0) {
        lVar4 = 0;
        do {
          piVar2 = *(int **)((long)((long)uVar3._M_t.
                                          super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                          .
                                          super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>
                                          ._M_head_impl + 8) + lVar4);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                   ::InternalSerialize(2,piVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(piVar2 + 2),target,stream);
          field_name._M_str = in_R9;
          field_name._M_len = (size_t)"proto3_unittest.TestProto3BytesMap.map_string";
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    (*(WireFormatLite **)(piVar2 + 2),(char *)(ulong)(uint)piVar2[4],1,0x2d,
                     field_name);
          lVar4 = lVar4 + 0x10;
        } while (local_48.size_ << 4 != lVar4);
      }
      this = local_38;
      if ((_Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>)
          local_48.items_._M_t.
          super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
          .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>)0x0) {
        operator_delete__((void *)local_48.items_._M_t.
                                  super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
                                  .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>.
                                  _M_head_impl);
      }
    }
    else {
      uVar7 = *(uint *)((long)&this->field_0 + 0x48);
      uVar6 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x44)) {
        plVar5 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_string_.
                                             super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             .field_0 + 0x10) + uVar6 * 8);
        if (plVar5 != (long *)0x0) {
          do {
            do {
              target = google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                       ::InternalSerialize(2,(int *)(plVar5 + 1),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(plVar5 + 2),target,stream);
              field_name_00._M_str = in_R9;
              field_name_00._M_len = (size_t)"proto3_unittest.TestProto3BytesMap.map_string";
              google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        ((WireFormatLite *)plVar5[2],(char *)(ulong)*(uint *)(plVar5 + 3),1,0x2d,
                         field_name_00);
              plVar5 = (long *)*plVar5;
            } while (plVar5 != (long *)0x0);
            do {
              uVar7 = (int)uVar6 + 1;
              uVar6 = (ulong)uVar7;
              if (*(uint *)((long)&this->field_0 + 0x44) <= uVar7) goto LAB_00c74051;
              plVar5 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_string_.
                                                                                                      
                                                  super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0 + 0x10) + (ulong)uVar7 * 8);
            } while (plVar5 == (long *)0x0);
          } while( true );
        }
LAB_00c74085:
        google::protobuf::internal::protobuf_assumption_failed
                  ("node != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                   ,0x22e);
      }
    }
  }
LAB_00c74051:
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestProto3BytesMap::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestProto3BytesMap& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_unittest.TestProto3BytesMap)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<int32, bytes> map_bytes = 1;
  if (!this_._internal_map_bytes().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_BYTES>;
    const auto& field = this_._internal_map_bytes();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, string> map_string = 2;
  if (!this_._internal_map_string().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_map_string();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.second.data(), static_cast<int>(entry.second.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto3_unittest.TestProto3BytesMap.map_string");
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.second.data(), static_cast<int>(entry.second.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto3_unittest.TestProto3BytesMap.map_string");
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_unittest.TestProto3BytesMap)
  return target;
}